

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasmFPU_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmFBcc<(moira::Instr)188,(moira::Mode)12,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  char cVar4;
  long lVar5;
  uint uVar6;
  
  uVar6 = *addr + 2;
  *addr = uVar6;
  iVar3 = (*this->_vptr_Moira[6])(this,(ulong)uVar6);
  if ((op & 0x7f) != 0 || (short)iVar3 != 0) {
    cVar4 = 'f';
    lVar5 = 0;
    do {
      pcVar2 = str->ptr;
      str->ptr = pcVar2 + 1;
      *pcVar2 = cVar4;
      cVar4 = "sfb"[lVar5 + 2];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 2);
    StrWriter::operator<<(str,(Fcc)(op & 0x1f));
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar2 = str->ptr;
      str->ptr = pcVar2 + 1;
      *pcVar2 = ' ';
    }
    else {
      iVar1 = (str->tab).raw;
      do {
        pcVar2 = str->ptr;
        str->ptr = pcVar2 + 1;
        *pcVar2 = ' ';
      } while (str->ptr < str->base + iVar1);
    }
    StrWriter::operator<<(str,(UInt)(uVar6 + (int)(short)iVar3));
    return;
  }
  cVar4 = 'f';
  lVar5 = 0;
  do {
    pcVar2 = str->ptr;
    str->ptr = pcVar2 + 1;
    *pcVar2 = cVar4;
    cVar4 = "fnop"[lVar5 + 1];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar2 = str->ptr;
    str->ptr = pcVar2 + 1;
    *pcVar2 = ' ';
  }
  return;
}

Assistant:

void
Moira::dasmFBcc(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead<S>(addr);
    auto cnd = ___________xxxxx (op);

    // Check for special FNOP opcode
    if ((op & 0x7F) == 0 && ext == 0) {

        dasmFNop<Instr::FNOP, M, S>(str, addr, op);
        return;
    }

    auto dst = old + 2;
    U32_INC(dst, SEXT<S>(ext));

    if (S == Long) {
        str << Ins<I>{} << Fcc{cnd} << Sz<S>{} << str.tab << UInt(dst);
    } else {
        str << Ins<I>{} << Fcc{cnd} << str.tab << UInt(dst);
    }
}